

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestUpdateCommand::Clone(cmCTestUpdateCommand *this)

{
  cmCommand *this_00;
  cmCTestUpdateCommand *ni;
  cmCTestUpdateCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0xa8);
  cmCTestUpdateCommand((cmCTestUpdateCommand *)this_00);
  this_00[1]._vptr_cmCommand =
       (_func_int **)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  this_00[1].Makefile =
       (cmMakefile *)(this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestUpdateCommand* ni = new cmCTestUpdateCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }